

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_access_block_segment_idx(Integer g_a,Integer proc,AccessIndex *index,Integer *len)

{
  long icode;
  int iVar1;
  Integer IVar2;
  DoubleComplex **ppDVar3;
  sbyte sVar4;
  ulong uVar5;
  ulong uVar6;
  DoubleComplex *pDVar7;
  char *ptr;
  ulong local_20;
  
  icode = g_a + 1000;
  pnga_access_block_segment_ptr(g_a,proc,&local_20,len);
  iVar1 = GA[icode].elemsize;
  IVar2 = pnga_type_c2f((long)GA[icode].type);
  pDVar7 = (DoubleComplex *)0x0;
  sVar4 = 3;
  switch(IVar2) {
  case 0x3f2:
    ppDVar3 = (DoubleComplex **)&INT_MB;
    break;
  default:
    goto switchD_0017a840_caseD_3f3;
  case 0x3f4:
    sVar4 = 2;
    ppDVar3 = (DoubleComplex **)&FLT_MB;
    break;
  case 0x3f5:
    ppDVar3 = (DoubleComplex **)&DBL_MB;
    break;
  case 0x3f6:
    ppDVar3 = (DoubleComplex **)&SCPL_MB;
    break;
  case 0x3f7:
    sVar4 = 4;
    ppDVar3 = &DCPL_MB;
  }
  pDVar7 = *ppDVar3;
  *index = (long)(local_20 - (long)pDVar7) >> sVar4;
switchD_0017a840_caseD_3f3:
  uVar5 = local_20 % (ulong)(long)iVar1;
  uVar6 = (ulong)pDVar7 % (ulong)(long)iVar1;
  if (uVar5 != uVar6) {
    printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(ulong)(uint)GAme,local_20,uVar5,pDVar7,uVar6);
    pnga_error("nga_access_block_segment: MA addressing problem: base address misallignment",icode);
  }
  *index = *index + 1;
  return;
}

Assistant:

void pnga_access_block_segment_idx(Integer g_a, Integer proc,
                                        AccessIndex* index, Integer *len)
{
char     *ptr;
Integer  handle = GA_OFFSET + g_a;
/*Integer  p_handle;*/
unsigned long    elemsize;
unsigned long    lref=0, lptr;

   
   /*p_handle = GA[handle].p_handle;*/

   /*
    * return patch address as the distance elements from the reference address
    *
    * .in Fortran we need only the index to the type array: dbl_mb or int_mb
    *  that are elements of COMMON in the the mafdecls.h include file
    * .in C we need both the index and the pointer
    */
   pnga_access_block_segment_ptr(g_a, proc, &ptr, len);

   elemsize = (unsigned long)GA[handle].elemsize;

   /* compute index and check if it is correct */
   switch (pnga_type_c2f(GA[handle].type)){
     case MT_F_DBL:
        *index = (AccessIndex) ((DoublePrecision*)ptr - DBL_MB);
        lref = (unsigned long)DBL_MB;
        break;

     case MT_F_DCPL:
        *index = (AccessIndex) ((DoubleComplex*)ptr - DCPL_MB);
        lref = (unsigned long)DCPL_MB;
        break;

     case MT_F_SCPL:
        *index = (AccessIndex) ((SingleComplex*)ptr - SCPL_MB);
        lref = (unsigned long)SCPL_MB;
        break;

     case MT_F_INT:
        *index = (AccessIndex) ((Integer*)ptr - INT_MB);
        lref = (unsigned long)INT_MB;
        break;

     case MT_F_REAL:
        *index = (AccessIndex) ((float*)ptr - FLT_MB);
        lref = (unsigned long)FLT_MB;
        break;        
   }

   /* check the allignment */
   lptr = (unsigned long)ptr;
   if( lptr%elemsize != lref%elemsize ){ 
       printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
                                                    lref,lref%elemsize);
       pnga_error("nga_access_block_segment: MA addressing problem: base address misallignment",
                 handle);
   }

   /* adjust index for Fortran addressing */
   (*index) ++ ;
   FLUSH_CACHE;

}